

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

int ndiGetGXPassiveStray(ndicapi *pol,int i,double *coord)

{
  long lVar1;
  char *cp;
  int local_34;
  int n;
  char *dp;
  double *coord_local;
  int i_local;
  ndicapi *pol_local;
  
  if (pol->GxPassiveStray[0] == '\0') {
    pol_local._4_4_ = 1;
  }
  else {
    lVar1 = ndiSignedToLong(pol->GxPassiveStray,3);
    local_34 = (int)lVar1;
    if (local_34 < 0) {
      pol_local._4_4_ = 2;
    }
    else {
      if (0x14 < local_34) {
        local_34 = 0x14;
      }
      if ((i < 0) || (local_34 <= i)) {
        pol_local._4_4_ = 2;
      }
      else {
        cp = pol->GxPassiveStray + (long)(i * 0x15) + 3;
        lVar1 = ndiSignedToLong(cp,7);
        *coord = (double)lVar1 * 0.01;
        lVar1 = ndiSignedToLong(cp + 7,7);
        coord[1] = (double)lVar1 * 0.01;
        lVar1 = ndiSignedToLong(cp + 0xe,7);
        coord[2] = (double)lVar1 * 0.01;
        pol_local._4_4_ = 0;
      }
    }
  }
  return pol_local._4_4_;
}

Assistant:

ndicapiExport int ndiGetGXPassiveStray(ndicapi* pol, int i, double coord[3])
{
  const char* dp;
  int n;

  dp = pol->GxPassiveStray;

  if (*dp == '\0')
  {
    return NDI_DISABLED;
  }

  n = (int)ndiSignedToLong(dp, 3);
  dp += 3;
  if (n < 0)
  {
    return NDI_MISSING;
  }
  if (n > 20)
  {
    n = 20;
  }

  if (i < 0 || i >= n)
  {
    return NDI_MISSING;
  }

  dp += 7 * 3 * i;
  coord[0] = ndiSignedToLong(&dp[0],  7) * 0.01;
  coord[1] = ndiSignedToLong(&dp[7],  7) * 0.01;
  coord[2] = ndiSignedToLong(&dp[14], 7) * 0.01;

  return NDI_OKAY;
}